

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miner.cpp
# Opt level: O3

void node::ApplyArgsManOptions(ArgsManager *args,Options *options)

{
  _Alloc_hider _Var1;
  bool bVar2;
  size_t sVar3;
  long in_FS_OFFSET;
  optional<long> oVar4;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  blockmintxfee;
  string local_70;
  undefined1 local_50 [32];
  bool local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  _Var1._M_p = local_50 + 0x10;
  local_50._0_8_ = _Var1._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"-blockmaxweight","");
  sVar3 = ArgsManager::GetIntArg(args,(string *)local_50,options->nBlockMaxWeight);
  options->nBlockMaxWeight = sVar3;
  if ((pointer)local_50._0_8_ != _Var1._M_p) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"-blockmintxfee","");
  ArgsManager::GetArg((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_50,args,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_30 == true) {
    oVar4 = ParseMoney((string *)local_50);
    if (((undefined1  [16])
         oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
        & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      (options->blockMinFeeRate).nSatoshisPerK =
           oVar4.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
    }
  }
  if (local_30 == true) {
    local_30 = false;
    if ((pointer)local_50._0_8_ != _Var1._M_p) {
      operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
    }
  }
  local_50._0_8_ = _Var1._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"-printpriority","");
  bVar2 = ArgsManager::GetBoolArg(args,(string *)local_50,options->print_modified_fee);
  options->print_modified_fee = bVar2;
  if ((pointer)local_50._0_8_ != _Var1._M_p) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ApplyArgsManOptions(const ArgsManager& args, BlockAssembler::Options& options)
{
    // Block resource limits
    options.nBlockMaxWeight = args.GetIntArg("-blockmaxweight", options.nBlockMaxWeight);
    if (const auto blockmintxfee{args.GetArg("-blockmintxfee")}) {
        if (const auto parsed{ParseMoney(*blockmintxfee)}) options.blockMinFeeRate = CFeeRate{*parsed};
    }
    options.print_modified_fee = args.GetBoolArg("-printpriority", options.print_modified_fee);
}